

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuaternion.h
# Opt level: O3

btVector3 quatRotate(btQuaternion *rotation,btVector3 *v)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  btVector3 bVar14;
  
  fVar1 = (rotation->super_btQuadWord).m_floats[3];
  fVar8 = v->m_floats[0];
  fVar2 = (rotation->super_btQuadWord).m_floats[0];
  uVar3 = *(undefined8 *)((rotation->super_btQuadWord).m_floats + 1);
  fVar12 = (float)*(undefined8 *)(v->m_floats + 1);
  fVar13 = (float)((ulong)*(undefined8 *)(v->m_floats + 1) >> 0x20);
  fVar4 = (float)uVar3;
  fVar5 = (float)((ulong)uVar3 >> 0x20);
  fVar9 = -fVar5;
  fVar10 = -fVar2;
  fVar6 = (fVar8 * fVar1 + fVar13 * fVar4) - fVar5 * fVar12;
  fVar7 = (fVar12 * fVar1 + fVar8 * fVar5) - fVar2 * fVar13;
  fVar11 = (fVar1 * fVar13 + fVar12 * fVar2) - fVar4 * fVar8;
  fVar8 = fVar13 * fVar9 + (fVar8 * fVar10 - fVar12 * fVar4);
  bVar14.m_floats[0] = fVar4 * fVar11 + fVar7 * fVar9 + fVar10 * fVar8 + fVar1 * fVar6;
  bVar14.m_floats[1] = fVar6 * fVar5 + fVar10 * fVar11 + -fVar4 * fVar8 + fVar7 * fVar1;
  bVar14.m_floats[2] = fVar7 * fVar2 + -fVar4 * fVar6 + fVar9 * fVar8 + fVar11 * fVar1;
  bVar14.m_floats[3] = 0.0;
  return (btVector3)bVar14.m_floats;
}

Assistant:

SIMD_FORCE_INLINE btQuaternion
operator*(const btQuaternion& q, const btVector3& w)
{
#if defined (BT_USE_SSE_IN_API) && defined (BT_USE_SSE)
	__m128 vQ1 = q.get128();
	__m128 vQ2 = w.get128();
	__m128 A1, B1, A2, B2, A3, B3;
	
	A1 = bt_pshufd_ps(vQ1, BT_SHUFFLE(3,3,3,0));
	B1 = bt_pshufd_ps(vQ2, BT_SHUFFLE(0,1,2,0));

	A1 = A1 * B1;
	
	A2 = bt_pshufd_ps(vQ1, BT_SHUFFLE(1,2,0,1));
	B2 = bt_pshufd_ps(vQ2, BT_SHUFFLE(2,0,1,1));

	A2 = A2 * B2;

	A3 = bt_pshufd_ps(vQ1, BT_SHUFFLE(2,0,1,2));
	B3 = bt_pshufd_ps(vQ2, BT_SHUFFLE(1,2,0,2));
	
	A3 = A3 * B3;	//	A3 *= B3

	A1 = A1 + A2;	//	AB12
	A1 = _mm_xor_ps(A1, vPPPM);	//	change sign of the last element
    A1 = A1 - A3;	//	AB123 = AB12 - AB3 
	
	return btQuaternion(A1);
    
#elif defined(BT_USE_NEON)     

	float32x4_t vQ1 = q.get128();
	float32x4_t vQ2 = w.get128();
	float32x4_t A1, B1, A2, B2, A3, B3;
    float32x2_t vQ1wx, vQ2zx, vQ1yz, vQ2yz, vQ1zx, vQ2xz;
    
    vQ1wx = vext_f32(vget_high_f32(vQ1), vget_low_f32(vQ1), 1); 
    {
    float32x2x2_t tmp;

    tmp = vtrn_f32( vget_high_f32(vQ2), vget_low_f32(vQ2) );       // {z x}, {w y}
    vQ2zx = tmp.val[0];

    tmp = vtrn_f32( vget_high_f32(vQ1), vget_low_f32(vQ1) );       // {z x}, {w y}
    vQ1zx = tmp.val[0];
    }

    vQ1yz = vext_f32(vget_low_f32(vQ1), vget_high_f32(vQ1), 1);

    vQ2yz = vext_f32(vget_low_f32(vQ2), vget_high_f32(vQ2), 1);
    vQ2xz = vext_f32(vQ2zx, vQ2zx, 1);

    A1 = vcombine_f32(vdup_lane_f32(vget_high_f32(vQ1), 1), vQ1wx); // W W  W X 
    B1 = vcombine_f32(vget_low_f32(vQ2), vQ2zx);                    // X Y  z x 

	A2 = vcombine_f32(vQ1yz, vget_low_f32(vQ1));
    B2 = vcombine_f32(vQ2zx, vdup_lane_f32(vget_low_f32(vQ2), 1));

    A3 = vcombine_f32(vQ1zx, vQ1yz);        // Z X Y Z
    B3 = vcombine_f32(vQ2yz, vQ2xz);        // Y Z x z

	A1 = vmulq_f32(A1, B1);
	A2 = vmulq_f32(A2, B2);
	A3 = vmulq_f32(A3, B3);	//	A3 *= B3

	A1 = vaddq_f32(A1, A2);	//	AB12 = AB1 + AB2
	
    //	change the sign of the last element
    A1 = (btSimdFloat4)veorq_s32((int32x4_t)A1, (int32x4_t)vPPPM);	
	
    A1 = vsubq_f32(A1, A3);	//	AB123 = AB12 - AB3
	
	return btQuaternion(A1);
    
#else
	return btQuaternion( 
         q.w() * w.x() + q.y() * w.z() - q.z() * w.y(),
		 q.w() * w.y() + q.z() * w.x() - q.x() * w.z(),
		 q.w() * w.z() + q.x() * w.y() - q.y() * w.x(),
		-q.x() * w.x() - q.y() * w.y() - q.z() * w.z()); 
#endif
}